

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::registerFederate(Federate *this,FederateInfo *fedInfo)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type sVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  long in_RSI;
  long in_RDI;
  __sv_type _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffffa0;
  FederateInfo *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  LocalFederateId *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar7;
  Core **__args;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x33fcb1);
  _Var6 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  uVar2 = (**(code **)((this_00->_M_dataplus)._M_p + 0xb0))
                    (this_00,_Var6._M_len,_Var6._M_str,in_RSI);
  *(undefined4 *)(in_RDI + 0x10) = uVar2;
  sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0);
  if (sVar4 != 0xffffffffffffffff) {
    peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x33fd23);
    (*peVar5->_vptr_Core[0x17])(peVar5,(ulong)*(uint *)(in_RDI + 0x10));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,in_stack_ffffffffffffff88);
  }
  *(undefined1 *)(in_RDI + 9) = *(undefined1 *)(in_RSI + 0x4c);
  bVar1 = FederateInfo::checkFlagProperty
                    (in_stack_ffffffffffffffa8,(int)(in_stack_ffffffffffffffa0 >> 0x20),
                     SUB81(in_stack_ffffffffffffffa0 >> 0x18,0));
  *(bool *)(in_RDI + 10) = bVar1;
  *(byte *)(in_RDI + 0xb) = *(byte *)(in_RSI + 0x59) & 1;
  *(byte *)(in_RDI + 0xc) = *(byte *)(in_RSI + 0x4f) & 1;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,in_stack_ffffffffffffff88);
  peVar5 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x33fdbb);
  uVar7 = *(uint *)(in_RDI + 0x10);
  iVar3 = (*peVar5->_vptr_Core[0x21])(peVar5,(ulong)uVar7);
  __args = (Core **)CONCAT44(extraout_var,iVar3);
  *(Core ***)(in_RDI + 0x28) = __args;
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    std::make_unique<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,std::mutex>>();
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator=((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 *)this_00,
                (unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 *)in_stack_ffffffffffffff88);
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::~unique_ptr((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                   *)this_00);
  }
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x18));
  std::
  make_unique<helics::ConnectorFederateManager,helics::Core*,helics::Federate*,helics::LocalFederateId&,bool&>
            (__args,(Federate **)CONCAT44(uVar7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
             ,(bool *)in_stack_ffffffffffffffb0);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator=((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)this_00,
              (unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)in_stack_ffffffffffffff88);
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                 *)this_00);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x33fe81);
  if (!bVar1) {
    registerConnectorInterfaces((Federate *)_Var6._M_str,(string *)_Var6._M_len);
  }
  return;
}

Assistant:

void Federate::registerFederate(const FederateInfo& fedInfo)
{
    // this call will throw an error on failure
    fedID = coreObject->registerFederate(mName, fedInfo);
    if (mName.find("${") != std::string::npos) {
        mName = coreObject->getFederateName(fedID);
    }

    nameSegmentSeparator = fedInfo.separator;
    strictConfigChecking = fedInfo.checkFlagProperty(defs::Flags::STRICT_CONFIG_CHECKING, true);

    useJsonSerialization = fedInfo.useJsonSerialization;
    observerMode = fedInfo.observer;
    configFile = fedInfo.configString;
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (!singleThreadFederate) {
        asyncCallInfo = std::make_unique<shared_guarded_m<AsyncFedCallInfo>>();
    }
    cManager = std::make_unique<ConnectorFederateManager>(coreObject.get(),
                                                          this,
                                                          fedID,
                                                          singleThreadFederate);
    if (!configFile.empty()) {
        registerConnectorInterfaces(configFile);
    }
}